

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

int cs_op_count(csh ud,cs_insn *insn,uint op_type)

{
  cs_detail *pcVar1;
  int iVar2;
  long lVar3;
  
  if (ud == 0) {
    return -1;
  }
  if (*(int *)(ud + 0x68) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x58) = 0xb;
      return -1;
    }
    pcVar1 = insn->detail;
    if (pcVar1 != (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x58) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        iVar2 = 0;
        break;
      case 1:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.opcode[2] * 0x30 - lVar3 != 0;
            lVar3 = lVar3 + 0x30) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x2e) == op_type);
        }
        return iVar2;
      case 2:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.prefix[0] * 0x18 - lVar3 != 0;
            lVar3 = lVar3 + 0x18) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x16) == op_type);
        }
        return iVar2;
      case 3:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.op_count * 0x30 - lVar3 != 0;
            lVar3 = lVar3 + 0x30) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x3e) == op_type);
        }
        return iVar2;
      case 4:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.addr_size * 0x10 != lVar3; lVar3 = lVar3 + 0x10
            ) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x1a) == op_type);
        }
        return iVar2;
      case 5:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.rex * 0xc - lVar3 != 0; lVar3 = lVar3 + 0xc) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x1a) == op_type);
        }
        return iVar2;
      case 6:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 != lVar3; lVar3 = lVar3 + 0x20
            ) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x16) == op_type);
        }
        return iVar2;
      case 7:
        iVar2 = 0;
        for (lVar3 = 0; (ulong)(pcVar1->field_6).x86.prefix[0] * 0x10 != lVar3; lVar3 = lVar3 + 0x10
            ) {
          iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x12) == op_type);
        }
        return iVar2;
      default:
        *(undefined4 *)(ud + 0x58) = 3;
        return -1;
      }
      for (lVar3 = 0; (ulong)(pcVar1->field_6).arm.op_count * 0x28 - lVar3 != 0;
          lVar3 = lVar3 + 0x28) {
        iVar2 = iVar2 + (uint)(*(uint *)(pcVar1->groups + lVar3 + 0x42) == op_type);
      }
      return iVar2;
    }
  }
  *(undefined4 *)(ud + 0x58) = 7;
  return -1;
}

Assistant:

CAPSTONE_API cs_op_count(csh ud, const cs_insn *insn, unsigned int op_type)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++)
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++)
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++)
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++)
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++)
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++)
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++)
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++)
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
			break;
	}

	return count;
}